

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Token * __thiscall JSON::Parser::readWordToken(Token *__return_storage_ptr__,Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  string value;
  char *local_70;
  size_type local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  string local_50 [32];
  
  iVar2 = this->pos;
  iVar5 = iVar2;
  while (iVar5 < this->length) {
    bVar4 = isWordChar((uint)(byte)(this->input)._M_dataplus._M_p[iVar5]);
    if (!bVar4) break;
    iVar5 = this->pos + 1;
    this->pos = iVar5;
  }
  std::__cxx11::string::substr((ulong)local_50,(ulong)&this->input);
  std::__cxx11::string::string((string *)&local_70,local_50);
  sVar3 = local_68;
  iVar5 = this->pos;
  __return_storage_ptr__->type = WORD;
  paVar1 = &(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
  if (local_70 == &local_60) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_5f,local_60);
    *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_58;
  }
  else {
    (__return_storage_ptr__->value)._M_dataplus._M_p = local_70;
    (__return_storage_ptr__->value).field_2._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
  }
  local_68 = 0;
  (__return_storage_ptr__->value)._M_string_length = sVar3;
  local_60 = '\0';
  __return_storage_ptr__->start = iVar2;
  __return_storage_ptr__->end = iVar5;
  local_70 = &local_60;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

Token Parser::readWordToken() {
        int chunkStart = pos;
        while (isValidPos() && isWordChar(getCodeAt(pos))) {
            pos++;
        }

        string value = input.substr(chunkStart, pos - chunkStart);
        return Token(WORD, value, chunkStart, pos);
    }